

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufUpdateInput(xmlBufPtr buf,xmlParserInputPtr input,size_t pos)

{
  xmlChar *pxVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = -1;
  if (input != (xmlParserInputPtr)0x0 && buf != (xmlBufPtr)0x0) {
    uVar3 = (ulong)buf->compat_size;
    if ((uVar3 < 0x7fffffff) && (buf->size != uVar3)) {
      buf->size = uVar3;
    }
    uVar3 = (ulong)buf->compat_use;
    if ((uVar3 < 0x7fffffff) && (buf->use != uVar3)) {
      buf->use = uVar3;
    }
    pxVar1 = buf->content;
    input->base = pxVar1;
    input->cur = pxVar1 + pos;
    input->end = pxVar1 + buf->use;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
xmlBufUpdateInput(xmlBufPtr buf, xmlParserInputPtr input, size_t pos) {
    if ((buf == NULL) || (input == NULL))
        return(-1);
    CHECK_COMPAT(buf)
    input->base = buf->content;
    input->cur = input->base + pos;
    input->end = &buf->content[buf->use];
    return(0);
}